

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gepard-stroke-builder.cpp
# Opt level: O0

void __thiscall
gepard::StrokePathBuilder::LineAttributes::set
          (LineAttributes *this,FloatPoint *from,FloatPoint *to,Float halfWidth)

{
  bool bVar1;
  Float FVar2;
  FloatPoint FVar3;
  Float local_48;
  Float local_40;
  Float local_38;
  Float local_30;
  Float halfWidth_local;
  FloatPoint *to_local;
  FloatPoint *from_local;
  LineAttributes *this_local;
  
  (this->location).x = from->x;
  (this->location).y = from->y;
  FVar3 = operator-(to,from);
  local_38 = FVar3.x;
  (this->vector).x = local_38;
  local_30 = FVar3.y;
  (this->vector).y = local_30;
  bVar1 = FloatPoint::isZero(&this->vector);
  if (!bVar1) {
    FVar2 = FloatPoint::length(&this->vector);
    this->length = FVar2;
    FVar3 = operator/(&this->vector,&this->length);
    local_48 = FVar3.x;
    (this->unit).x = local_48;
    local_40 = FVar3.y;
    (this->unit).y = local_40;
    (this->thicknessOffsets).x = halfWidth * (this->unit).x;
    (this->thicknessOffsets).y = halfWidth * (this->unit).y;
    FloatPoint::set(&this->startTop,from->x + (this->thicknessOffsets).y,
                    from->y - (this->thicknessOffsets).x);
    FloatPoint::set(&this->startBottom,from->x - (this->thicknessOffsets).y,
                    from->y + (this->thicknessOffsets).x);
    FloatPoint::set(&this->endBottom,to->x - (this->thicknessOffsets).y,
                    to->y + (this->thicknessOffsets).x);
    FloatPoint::set(&this->endTop,to->x + (this->thicknessOffsets).y,
                    to->y - (this->thicknessOffsets).x);
  }
  return;
}

Assistant:

void StrokePathBuilder::LineAttributes::set(const FloatPoint& from, const FloatPoint& to, const Float halfWidth)
{
    location = from;
    vector = to - from;

    if (vector.isZero())
        return;

    length = vector.length();
    unit = vector / length;

    thicknessOffsets.x = halfWidth * unit.x;
    thicknessOffsets.y = halfWidth * unit.y;

    startTop.set(from.x + thicknessOffsets.y, from.y - thicknessOffsets.x);
    startBottom.set(from.x - thicknessOffsets.y, from.y + thicknessOffsets.x);
    endBottom.set(to.x - thicknessOffsets.y, to.y + thicknessOffsets.x);
    endTop.set(to.x + thicknessOffsets.y, to.y - thicknessOffsets.x);
}